

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::ShadeVertsLinearUV
               (ImDrawVert *vert_start,ImDrawVert *vert_end,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
               ImVec2 *uv_b,bool clamp)

{
  ImVec2 IVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar12;
  undefined1 auVar11 [16];
  float fVar13;
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar11._0_4_ = (*b).x - (*a).x;
  auVar11._4_4_ = (*b).y - (*a).y;
  auVar11._8_8_ = 0;
  IVar8 = *uv_b;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = IVar8.x;
  auVar14._4_4_ = IVar8.y;
  IVar1 = *uv_a;
  fVar13 = IVar8.x;
  fVar16 = IVar8.y;
  fVar10 = IVar1.x;
  auVar5._0_4_ = fVar13 - fVar10;
  fVar12 = IVar1.y;
  auVar5._4_4_ = fVar16 - fVar12;
  auVar5._8_8_ = 0;
  auVar5 = divps(auVar5,auVar11);
  fVar4 = (float)(auVar5._0_4_ & -(uint)(auVar11._0_4_ != 0.0));
  fVar6 = (float)(auVar5._4_4_ & -(uint)(auVar11._4_4_ != 0.0));
  if (clamp) {
    if (vert_start < vert_end) {
      auVar7._8_8_ = 0;
      auVar7._0_4_ = IVar1.x;
      auVar7._4_4_ = IVar1.y;
      auVar5 = minps(auVar7,auVar14);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = CONCAT44(~-(uint)(fVar16 <= fVar12) & (uint)fVar16,
                              ~-(uint)(fVar13 <= fVar10) & (uint)fVar13) |
                     CONCAT44((uint)fVar12 & -(uint)(fVar16 <= fVar12),
                              (uint)fVar10 & -(uint)(fVar13 <= fVar10));
      do {
        auVar15._0_4_ = (*uv_a).x + ((vert_start->pos).x - (*a).x) * fVar4;
        auVar15._4_4_ = (*uv_a).y + ((vert_start->pos).y - (*a).y) * fVar6;
        auVar15._8_8_ = 0;
        auVar11 = minps(auVar9,auVar15);
        uVar2 = -(uint)(auVar15._0_4_ < auVar5._0_4_);
        uVar3 = -(uint)(auVar15._4_4_ < auVar5._4_4_);
        vert_start->uv =
             (ImVec2)(CONCAT44(~uVar3 & auVar11._4_4_,~uVar2 & auVar11._0_4_) |
                     CONCAT44((uint)auVar5._4_4_ & uVar3,(uint)auVar5._0_4_ & uVar2));
        vert_start = vert_start + 1;
      } while (vert_start < vert_end);
    }
  }
  else {
    for (; vert_start < vert_end; vert_start = vert_start + 1) {
      IVar8.x = (*uv_a).x + ((vert_start->pos).x - (*a).x) * fVar4;
      IVar8.y = (*uv_a).y + ((vert_start->pos).y - (*a).y) * fVar6;
      vert_start->uv = IVar8;
    }
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawVert* vert_start, ImDrawVert* vert_end, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);

        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}